

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O3

TPZFYsmpMatrix<std::complex<float>_> * __thiscall
TPZFYsmpMatrix<std::complex<float>_>::operator+
          (TPZFYsmpMatrix<std::complex<float>_> *__return_storage_ptr__,
          TPZFYsmpMatrix<std::complex<float>_> *this,TPZFYsmpMatrix<std::complex<float>_> *mat)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  long lVar3;
  complex<float> *pcVar4;
  long lVar5;
  
  (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x4a])(this);
  TPZFYsmpMatrix(__return_storage_ptr__,this);
  lVar3 = (__return_storage_ptr__->fA).fNElements;
  if (0 < lVar3) {
    lVar5 = 0;
    do {
      pcVar4 = (__return_storage_ptr__->fA).fStore;
      _Var1 = (mat->fA).fStore[lVar5]._M_value;
      _Var2 = pcVar4[lVar5]._M_value;
      pcVar4[lVar5]._M_value =
           CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZFYsmpMatrix<TVar> TPZFYsmpMatrix<TVar>::operator+(const TPZFYsmpMatrix<TVar>&mat) const
{
	CheckTypeCompatibility(this,&mat);
	auto res(*this);
  const auto sizeA = res.fA.size();
  for(auto i = 0; i < sizeA; i++) res.fA[i] += mat.fA[i];
	return res;
}